

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_pipe_recv(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  nni_aio *pnVar2;
  
  nni_aio_reset(aio);
  mtx = (nni_mtx *)((long)arg + 0x608);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x18) == '\x01') {
    nni_mtx_unlock(mtx);
    nni_aio_finish_error(aio,NNG_ECLOSED);
    return;
  }
  _Var1 = nni_aio_start(aio,ipc_pipe_recv_cancel,arg);
  if (_Var1) {
    nni_list_append((nni_list *)((long)arg + 0x78),aio);
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x78));
    if (pnVar2 == aio) {
      ipc_pipe_recv_start((ipc_pipe *)arg);
    }
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
ipc_pipe_recv(void *arg, nni_aio *aio)
{
	ipc_pipe *p = arg;

	nni_aio_reset(aio);
	nni_mtx_lock(&p->mtx);
	if (p->closed) {
		nni_mtx_unlock(&p->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (!nni_aio_start(aio, ipc_pipe_recv_cancel, p)) {
		nni_mtx_unlock(&p->mtx);
		return;
	}

	nni_list_append(&p->recv_q, aio);
	if (nni_list_first(&p->recv_q) == aio) {
		ipc_pipe_recv_start(p);
	}
	nni_mtx_unlock(&p->mtx);
}